

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tests.cpp
# Opt level: O1

void test2(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string __str;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> xs;
  undefined1 local_98 [16];
  char *local_88 [2];
  uint local_78;
  bool local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_50;
  bool local_30;
  
  local_98._0_8_ = (pointer)0x100000004;
  std::
  _Head_base<1UL,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mtak-[P]haskell_traits/test/basic_tests.cpp:52:17),_true>
  ::anon_class_1_0_00000001_for__M_head_impl::operator()
            ((rebound_conflict *)&local_50,(anon_class_1_0_00000001_for__M_head_impl *)local_98,4);
  local_98._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/mtak-[P]haskell_traits/test/basic_tests.cpp"
  ;
  local_98._8_8_ = "xs == std::string(\"4\")";
  local_88[0] = "void test2()";
  local_88[1] = (char *)&local_50;
  local_78 = 0x7e;
  local_74 = false;
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"4","");
  test_impl::R<std::optional<std::__cxx11::string>&>::operator==
            ((R<std::optional<std::__cxx11::string>&> *)local_98,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  test_impl::
  R<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  ::~R((R<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        *)local_98);
  local_70._M_dataplus._M_p = (pointer)0x100000004;
  haskell_traits::v1::detail::
  INVOKE<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mtak_[P]haskell_traits_test_basic_tests_cpp:59:17),_int>
            ((result_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mtak_[P]haskell_traits_test_basic_tests_cpp:59:17)_&&,_int_&&>
              *)local_98,(anon_class_1_0_00000001_for__M_head_impl *)&local_70,(int *)&local_70);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,
                   (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_98);
  if ((local_78._0_1_ == true) &&
     (local_78 = local_78 & 0xffffff00, (char **)local_98._0_8_ != local_88)) {
    operator_delete((void *)local_98._0_8_,(ulong)((long)local_88[0] + 1));
  }
  local_98._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/mtak-[P]haskell_traits/test/basic_tests.cpp"
  ;
  local_98._8_8_ = "xs == std::to_string(sizeof(int))";
  local_88[0] = "void test2()";
  local_78 = 0x81;
  local_74 = false;
  local_88[1] = (char *)&local_50;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_70,'\x01');
  *local_70._M_dataplus._M_p = '4';
  test_impl::R<std::optional<std::__cxx11::string>&>::operator==
            ((R<std::optional<std::__cxx11::string>&> *)local_98,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  test_impl::
  R<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  ::~R((R<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        *)local_98);
  if ((local_30 == true) &&
     (local_30 = false,
     local_50._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_50._M_value + 0x10))) {
    operator_delete((void *)local_50._M_value._M_dataplus._M_p,local_50._16_8_ + 1);
  }
  return;
}

Assistant:

void test2()
{
    constexpr std::optional<int> x{4};
    std::optional<std::string>   xs = bindShowInt(x);
    CHECK(xs == std::string("4"));

    xs = bindShowSizeof(x);
    CHECK(xs == std::to_string(sizeof(int)));

    constexpr std::optional<float> b = ht::fmap(x, [](const int y) { return float(y); });
    static_assert(b == float(4));

    constexpr auto foo = [](std::string_view x) constexpr->int { return x.size(); };
    constexpr std::optional<decltype(foo)>    f{foo};
    constexpr std::optional<std::string_view> i{"foobar"};
    static_assert(ht::aapply(i, f) == 6);
    static_assert(i >> f == 6);
}